

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O1

bool duckdb::AddPropagateStatistics::Operation<long,duckdb::TryAddOperator>
               (LogicalType *type,BaseStatistics *lstats,BaseStatistics *rstats,Value *new_min,
               Value *new_max)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  Value local_70;
  
  lVar1 = NumericStats::GetMin<long>(lstats);
  lVar2 = NumericStats::GetMin<long>(rstats);
  bVar5 = true;
  if (!SCARRY8(lVar2,lVar1)) {
    lVar3 = NumericStats::GetMax<long>(lstats);
    lVar4 = NumericStats::GetMax<long>(rstats);
    if (!SCARRY8(lVar4,lVar3)) {
      Value::Numeric(&local_70,type,lVar2 + lVar1);
      Value::operator=(new_min,&local_70);
      Value::~Value(&local_70);
      Value::Numeric(&local_70,type,lVar4 + lVar3);
      Value::operator=(new_max,&local_70);
      Value::~Value(&local_70);
      bVar5 = false;
    }
  }
  return bVar5;
}

Assistant:

static bool Operation(const LogicalType &type, BaseStatistics &lstats, BaseStatistics &rstats, Value &new_min,
	                      Value &new_max) {
		T min, max;
		// new min is min+min
		if (!OP::Operation(NumericStats::GetMin<T>(lstats), NumericStats::GetMin<T>(rstats), min)) {
			return true;
		}
		// new max is max+max
		if (!OP::Operation(NumericStats::GetMax<T>(lstats), NumericStats::GetMax<T>(rstats), max)) {
			return true;
		}
		new_min = Value::Numeric(type, min);
		new_max = Value::Numeric(type, max);
		return false;
	}